

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::static_getp_packBytes(vm_val_t *retval,uint *pargc)

{
  int iVar1;
  vm_obj_id_t obj;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  int *in_RSI;
  vm_val_t *in_RDI;
  err_frame_t err_cur__;
  CVmMemorySource *dst;
  uint argc;
  CVmNativeCodeDesc *in_stack_fffffffffffffeb8;
  void *pvVar5;
  uint *in_stack_fffffffffffffec0;
  undefined8 uVar6;
  vm_val_t *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee0;
  int n;
  int iVar7;
  uint local_118 [2];
  undefined8 local_110;
  void *local_108;
  CVmDataSource *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  
  if (in_RSI == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RSI;
  }
  iVar7 = n;
  if ((static_getp_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&static_getp_packBytes(vm_val_t*,unsigned_int*)::desc), iVar1 != 0
     )) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&static_getp_packBytes::desc,1,0,1);
    __cxa_guard_release(&static_getp_packBytes(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 == 0) {
    plVar2 = (long *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource
              ((CVmMemorySource *)CONCAT44(iVar7,in_stack_fffffffffffffee0),(long)plVar2);
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_110 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_118;
    local_118[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff00);
    if (local_118[0] == 0) {
      CVmPack::pack(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      obj = create_latin1((int)((ulong)in_RDI >> 0x20),(CVmDataSource *)in_stack_fffffffffffffec8);
      vm_val_t::set_obj(in_RDI,obj);
    }
    if (((local_118[0] & 0x8000) == 0) &&
       (local_118[0] = local_118[0] | 0x8000, plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    uVar6 = local_110;
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar6;
    if ((local_118[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar2 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar2 + 0x10));
      }
      pvVar5 = local_108;
      plVar2 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar2 + 0x10) = pvVar5;
      err_rethrow();
    }
    if ((local_118[0] & 2) != 0) {
      free(local_108);
    }
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjString::static_getp_packBytes(VMG_ vm_val_t *retval, uint *pargc)
{
    /* check arguments */
    uint argc = (pargc != 0 ? *pargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, pargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a string from the byte stream */
        retval->set_obj(create_latin1(vmg_ FALSE, dst));
    }